

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O2

void __thiscall vera::Triangle::setTangent(Triangle *this,size_t _index,vec4 *_tangent)

{
  undefined8 *puVar1;
  pointer pvVar2;
  undefined8 uVar3;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar4;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar5;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar6;
  long lVar7;
  
  pvVar2 = (this->m_tangents).
           super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pvVar2 == (this->m_tangents).
                super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
    ::resize(&this->m_tangents,3);
    pvVar2 = (this->m_tangents).
             super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (lVar7 = 0; lVar7 != 0x30; lVar7 = lVar7 + 0x10) {
      uVar3 = *(undefined8 *)&_tangent->field_2;
      puVar1 = (undefined8 *)((long)&pvVar2->field_0 + lVar7);
      *puVar1 = *(undefined8 *)_tangent;
      puVar1[1] = uVar3;
    }
  }
  else {
    aVar4 = _tangent->field_1;
    aVar5 = _tangent->field_2;
    aVar6 = _tangent->field_3;
    pvVar2 = pvVar2 + _index;
    pvVar2->field_0 = _tangent->field_0;
    pvVar2->field_1 = aVar4;
    pvVar2->field_2 = aVar5;
    pvVar2->field_3 = aVar6;
  }
  return;
}

Assistant:

void Triangle::setTangent(size_t _index, const glm::vec4& _tangent) {
        if (m_tangents.empty()) {
        m_tangents.resize(3);
        std::fill(m_tangents.begin(), m_tangents.begin()+3, _tangent);
    }
    else
        m_tangents[_index] = _tangent;
}